

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.cpp
# Opt level: O3

int line_x1_proc(Am_Object *self)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Am_Value *pAVar4;
  Am_Object node;
  Am_Object local_20 [8];
  
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)START_NODE);
  Am_Object::Am_Object(local_20,pAVar4);
  cVar1 = Am_Object::Valid();
  if (cVar1 == '\0') {
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)self,(ulong)END_NODE);
    Am_Object::operator=(local_20,pAVar4);
  }
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_20,100);
  iVar2 = Am_Value::operator_cast_to_int(pAVar4);
  pAVar4 = (Am_Value *)Am_Object::Get((ushort)local_20,0x66);
  iVar3 = Am_Value::operator_cast_to_int(pAVar4);
  Am_Object::~Am_Object(local_20);
  return iVar3 / 2 + iVar2;
}

Assistant:

Am_Define_Formula(int, line_x1)
{
  Am_Object node = self.Get(START_NODE);
  if (!node.Valid())
    node = self.Get(END_NODE);
  return (int)node.Get(Am_LEFT) + (int)node.Get(Am_WIDTH) / 2;
}